

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferWriteTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Functional::BasicBufferDataCase::iterate(BasicBufferDataCase *this)

{
  GLenum target;
  int iVar1;
  deUint32 dVar2;
  uint uVar3;
  char *pcVar4;
  deUint8 *pdVar5;
  size_t in_R9;
  deUint32 buf;
  bool isOk;
  undefined1 local_38 [8];
  ReferenceBuffer refBuf;
  BufferVerifier verifier;
  deUint32 dataSeed;
  BasicBufferDataCase *this_local;
  
  pcVar4 = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(pcVar4);
  BufferTestUtil::BufferVerifier::BufferVerifier
            ((BufferVerifier *)
             &refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (this->super_BufferCase).super_TestCase.m_context,this->m_verify);
  BufferTestUtil::ReferenceBuffer::ReferenceBuffer((ReferenceBuffer *)local_38);
  BufferTestUtil::ReferenceBuffer::setSize((ReferenceBuffer *)local_38,this->m_size);
  pdVar5 = BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_38,0);
  BufferTestUtil::fillWithRandomBytes(pdVar5,this->m_size,dVar2 ^ 0x125);
  dVar2 = BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferCase).super_CallLogWrapper,this->m_target,dVar2);
  target = this->m_target;
  iVar1 = this->m_size;
  pdVar5 = BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_38,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BufferCase).super_CallLogWrapper,target,(long)iVar1,pdVar5,this->m_usage)
  ;
  BufferTestUtil::BufferCase::checkError(&this->super_BufferCase);
  pdVar5 = BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_38,0);
  uVar3 = BufferTestUtil::BufferVerifier::verify
                    ((BufferVerifier *)
                     &refBuf.m_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(EVP_PKEY_CTX *)(ulong)dVar2,pdVar5,
                     0,(uchar *)(ulong)(uint)this->m_size,in_R9);
  BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,dVar2);
  pcVar4 = "Buffer verification failed";
  if ((uVar3 & 1) != 0) {
    pcVar4 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (byte)~((byte)uVar3 & 1) & QP_TEST_RESULT_FAIL,pcVar4);
  BufferTestUtil::ReferenceBuffer::~ReferenceBuffer((ReferenceBuffer *)local_38);
  BufferTestUtil::BufferVerifier::~BufferVerifier
            ((BufferVerifier *)
             &refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const deUint32			dataSeed	= deStringHash(getName()) ^ 0x125;
		BufferVerifier			verifier	(m_context, m_verify);
		ReferenceBuffer			refBuf;
		bool					isOk		= false;

		refBuf.setSize(m_size);
		fillWithRandomBytes(refBuf.getPtr(), m_size, dataSeed);

		deUint32 buf = genBuffer();
		glBindBuffer(m_target, buf);
		glBufferData(m_target, m_size, refBuf.getPtr(), m_usage);

		checkError();

		isOk = verifier.verify(buf, refBuf.getPtr(), 0, m_size);

		deleteBuffer(buf);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}